

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O0

void testMinMaxEigenValue<Imath_2_5::Matrix44<double>>(Matrix44<double> *A)

{
  uint uVar1;
  Matrix44<double> *in_RDI;
  Matrix44<double> *pMVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int i;
  int dim;
  Matrix44<double> A3;
  Matrix44<double> A2;
  Matrix44<double> A1;
  T threshold;
  Matrix44<double> V;
  Matrix44<double> U;
  TV S;
  TV maxV;
  TV minV;
  Matrix44<double> *in_stack_fffffffffffffd00;
  int local_2f8;
  Matrix44 local_2f0 [32];
  Matrix44<double> *in_stack_fffffffffffffd30;
  Matrix44<double> local_270;
  Matrix44<double> local_1f0;
  BaseType_conflict2 local_170;
  Matrix44<double> local_168;
  Matrix44 local_e8 [128];
  Vec4<double> local_68;
  Vec4<double> local_48;
  Vec4<double> local_28;
  Matrix44<double> *local_8;
  
  local_8 = in_RDI;
  Imath_2_5::Vec4<double>::Vec4(&local_28);
  Imath_2_5::Vec4<double>::Vec4(&local_48);
  Imath_2_5::Vec4<double>::Vec4(&local_68);
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffffd00);
  Imath_2_5::Matrix44<double>::Matrix44(in_stack_fffffffffffffd00);
  local_170 = computeThreshold<Imath_2_5::Matrix44<double>>(in_stack_fffffffffffffd30);
  Imath_2_5::Matrix44<double>::Matrix44(&local_1f0,local_8);
  Imath_2_5::minEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
            ((Matrix44 *)&local_1f0,(Vec4 *)&local_28);
  Imath_2_5::Matrix44<double>::Matrix44(&local_270,local_8);
  Imath_2_5::maxEigenVector<Imath_2_5::Matrix44<double>,Imath_2_5::Vec4<double>>
            ((Matrix44 *)&local_270,(Vec4 *)&local_48);
  Imath_2_5::Matrix44<double>::Matrix44((Matrix44<double> *)local_2f0,local_8);
  dVar3 = Imath_2_5::limits<double>::epsilon();
  Imath_2_5::jacobiSVD<double>
            (local_2f0,local_e8,(Vec4 *)&local_68,(Matrix44 *)&local_168,dVar3,false);
  uVar1 = Imath_2_5::Matrix44<double>::dimensions();
  local_2f8 = 0;
  while( true ) {
    if ((int)uVar1 <= local_2f8) {
      return;
    }
    Imath_2_5::Vec4<double>::operator[](&local_28,local_2f8);
    pMVar2 = &local_168;
    Imath_2_5::Matrix44<double>::operator[](pMVar2,local_2f8);
    std::abs((int)pMVar2);
    if (local_170 <= extraout_XMM0_Qa) break;
    Imath_2_5::Vec4<double>::operator[](&local_48,local_2f8);
    pMVar2 = &local_168;
    Imath_2_5::Matrix44<double>::operator[](pMVar2,local_2f8);
    std::abs((int)pMVar2);
    if (local_170 <= extraout_XMM0_Qa_00) {
      __assert_fail("abs(maxV[i]-V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                    ,0xbb,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix44<double>]"
                   );
    }
    local_2f8 = local_2f8 + 1;
  }
  __assert_fail("abs(minV[i]-V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testJacobiEigenSolver.cpp"
                ,0xba,"void testMinMaxEigenValue(const TM &) [TM = Imath_2_5::Matrix44<double>]");
}

Assistant:

void
testMinMaxEigenValue(const TM& A)
{
  typedef typename TM::BaseVecType TV;
  typedef typename TM::BaseType T;

  TV minV, maxV, S;
  TM U, V;
  
  const T threshold = computeThreshold(A);

  {
      TM A1(A);
      minEigenVector(A1, minV);
      TM A2(A);
      maxEigenVector(A2, maxV);
  }
  {
      TM A3(A);
      jacobiSVD(A3, U, S, V);
  }

  const int dim = TM::dimensions();

  for(int i = 0; i < dim; ++i) {
      assert(abs(minV[i]-V[i][dim - 1]) < threshold);
      assert(abs(maxV[i]-V[i][0]) < threshold);
  }
}